

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

void mqtt_recv_consume(Curl_easy *data,size_t nbytes)

{
  size_t sVar1;
  dynbuf *s;
  
  s = &((data->req).p.mqtt)->recvbuf;
  sVar1 = Curl_dyn_len(s);
  if (nbytes <= sVar1 && sVar1 - nbytes != 0) {
    Curl_dyn_tail(s,sVar1 - nbytes);
    return;
  }
  Curl_dyn_reset(s);
  return;
}

Assistant:

static void mqtt_recv_consume(struct Curl_easy *data, size_t nbytes)
{
  struct MQTT *mq = data->req.p.mqtt;
  size_t rlen = Curl_dyn_len(&mq->recvbuf);
  if(rlen <= nbytes)
    Curl_dyn_reset(&mq->recvbuf);
  else
    Curl_dyn_tail(&mq->recvbuf, rlen - nbytes);
}